

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

pool_ptr<soul::AST::Expression> __thiscall
soul::StructuralParser::tryToParseExpressionIgnoringErrors(StructuralParser *this)

{
  anon_class_16_2_51289818 local_50;
  function<void_()> local_40;
  undefined1 local_19;
  StructuralParser *this_local;
  pool_ptr<soul::AST::Expression> *result;
  
  local_19 = 0;
  this_local = this;
  pool_ptr<soul::AST::Expression>::pool_ptr((pool_ptr<soul::AST::Expression> *)this);
  local_50.result = (pool_ptr<soul::AST::Expression> *)this;
  std::function<void()>::
  function<soul::StructuralParser::tryToParseExpressionIgnoringErrors()::_lambda()_1_,void>
            ((function<void()> *)&local_40,&local_50);
  catchParseErrors(&local_40);
  std::function<void_()>::~function(&local_40);
  return (pool_ptr<soul::AST::Expression>)(Expression *)this;
}

Assistant:

pool_ptr<AST::Expression> tryToParseExpressionIgnoringErrors()
    {
        pool_ptr<AST::Expression> result;
        catchParseErrors ([this, &result] { result = parseExpression(); });
        return result;
    }